

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltl_parser.c
# Opt level: O3

void traverseAbstractSyntaxTree(ltlNode *node)

{
  ltlNode_t *node_00;
  
  do {
    switch(node->type) {
    case AND:
      printf("& ");
      node_00 = node->left;
      if (node_00 == (ltlNode_t *)0x0) {
        __assert_fail("node->left != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                      ,0x17e,"void traverseAbstractSyntaxTree(ltlNode *)");
      }
      if (node->right == (ltlNode_t *)0x0) {
        __assert_fail("node->right != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                      ,0x17f,"void traverseAbstractSyntaxTree(ltlNode *)");
      }
      break;
    case OR:
      printf("+ ");
      node_00 = node->left;
      if (node_00 == (ltlNode_t *)0x0) {
        __assert_fail("node->left != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                      ,0x185,"void traverseAbstractSyntaxTree(ltlNode *)");
      }
      if (node->right == (ltlNode_t *)0x0) {
        __assert_fail("node->right != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                      ,0x186,"void traverseAbstractSyntaxTree(ltlNode *)");
      }
      break;
    case NOT:
      printf("~ ");
      if (node->left == (ltlNode *)0x0) {
        __assert_fail("node->left != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                      ,0x18c,"void traverseAbstractSyntaxTree(ltlNode *)");
      }
      traverseAbstractSyntaxTree(node->left);
      if (node->right == (ltlNode_t *)0x0) {
        return;
      }
      __assert_fail("node->right == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                    ,0x18e,"void traverseAbstractSyntaxTree(ltlNode *)");
    default:
      puts("\nUnsupported token type: Exiting execution");
      exit(0);
    case GLOBALLY:
      printf("G ");
      if (node->left == (ltlNode *)0x0) {
        __assert_fail("node->left != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                      ,0x192,"void traverseAbstractSyntaxTree(ltlNode *)");
      }
      traverseAbstractSyntaxTree(node->left);
      if (node->right == (ltlNode_t *)0x0) {
        return;
      }
      __assert_fail("node->right == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                    ,0x194,"void traverseAbstractSyntaxTree(ltlNode *)");
    case EVENTUALLY:
      printf("F ");
      if (node->left == (ltlNode *)0x0) {
        __assert_fail("node->left != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                      ,0x198,"void traverseAbstractSyntaxTree(ltlNode *)");
      }
      traverseAbstractSyntaxTree(node->left);
      if (node->right == (ltlNode_t *)0x0) {
        return;
      }
      __assert_fail("node->right == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                    ,0x19a,"void traverseAbstractSyntaxTree(ltlNode *)");
    case NEXT:
      printf("X ");
      if (node->left == (ltlNode *)0x0) {
        __assert_fail("node->left != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                      ,0x19e,"void traverseAbstractSyntaxTree(ltlNode *)");
      }
      traverseAbstractSyntaxTree(node->left);
      if (node->right == (ltlNode_t *)0x0) {
        return;
      }
      __assert_fail("node->right == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                    ,0x1a0,"void traverseAbstractSyntaxTree(ltlNode *)");
    case UNTIL:
      printf("U ");
      node_00 = node->left;
      if (node_00 == (ltlNode_t *)0x0) {
        __assert_fail("node->left != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                      ,0x1a4,"void traverseAbstractSyntaxTree(ltlNode *)");
      }
      if (node->right == (ltlNode_t *)0x0) {
        __assert_fail("node->right != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                      ,0x1a5,"void traverseAbstractSyntaxTree(ltlNode *)");
      }
      break;
    case BOOL:
      printf("%s ",node->name);
      if (node->left != (ltlNode_t *)0x0) {
        __assert_fail("node->left == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                      ,0x1ab,"void traverseAbstractSyntaxTree(ltlNode *)");
      }
      if (node->right == (ltlNode_t *)0x0) {
        return;
      }
      __assert_fail("node->right == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                    ,0x1ac,"void traverseAbstractSyntaxTree(ltlNode *)");
    }
    traverseAbstractSyntaxTree(node_00);
    node = node->right;
  } while( true );
}

Assistant:

void traverseAbstractSyntaxTree( ltlNode *node )
{
	switch(node->type){
		case( AND ):
			printf("& ");
			assert( node->left != NULL );
			assert( node->right != NULL );
			traverseAbstractSyntaxTree( node->left );
			traverseAbstractSyntaxTree( node->right );
			return;
		case( OR ):
			printf("+ ");
			assert( node->left != NULL );
			assert( node->right != NULL );
			traverseAbstractSyntaxTree( node->left );
			traverseAbstractSyntaxTree( node->right );
			return;
		case( NOT ):
			printf("~ ");
			assert( node->left != NULL );
			traverseAbstractSyntaxTree( node->left );
			assert( node->right == NULL );
			return;
		case( GLOBALLY ):
			printf("G ");
			assert( node->left != NULL );
			traverseAbstractSyntaxTree( node->left );
			assert( node->right == NULL );
			return;
		case( EVENTUALLY ):
			printf("F ");
			assert( node->left != NULL );
			traverseAbstractSyntaxTree( node->left );
			assert( node->right == NULL );
			return;
		case( NEXT ):
			printf("X ");
			assert( node->left != NULL );
			traverseAbstractSyntaxTree( node->left );
			assert( node->right == NULL );
			return;
		case( UNTIL ):
			printf("U ");
			assert( node->left != NULL );
			assert( node->right != NULL );
			traverseAbstractSyntaxTree( node->left );
			traverseAbstractSyntaxTree( node->right );
			return;
		case( BOOL ):
			printf("%s ", node->name);
			assert( node->left == NULL );
			assert( node->right == NULL );
			return;
		default:
			printf("\nUnsupported token type: Exiting execution\n");
			exit(0);
	}
}